

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_panner_process_pcm_frames
                    (ma_panner *pPanner,void *pFramesOut,void *pFramesIn,ma_uint64 frameCount)

{
  float fVar1;
  float fVar2;
  float fVar3;
  ma_uint32 mVar4;
  ma_format mVar5;
  ulong uVar6;
  ma_uint64 mVar7;
  float factorL1;
  
  if (pFramesIn == (void *)0x0 || (pFramesOut == (void *)0x0 || pPanner == (ma_panner *)0x0)) {
    return MA_INVALID_ARGS;
  }
  mVar4 = pPanner->channels;
  if (mVar4 == 1) {
    if (pFramesOut == pFramesIn) {
      return MA_SUCCESS;
    }
    uVar6 = (ulong)(uint)(&DAT_0019eb10)[pPanner->format];
  }
  else if (mVar4 == 2) {
    mVar5 = pPanner->format;
    fVar1 = pPanner->pan;
    if (pPanner->mode == ma_pan_mode_balance) {
      if (((fVar1 != 0.0) || (NAN(fVar1))) && (mVar5 == ma_format_f32)) {
        if (fVar1 <= 0.0) {
          if (pFramesOut == pFramesIn) {
            if (frameCount != 0) {
              mVar7 = 0;
              do {
                *(float *)((long)pFramesOut + mVar7 * 8 + 4) =
                     *(float *)((long)pFramesIn + mVar7 * 8 + 4) * (fVar1 + 1.0);
                mVar7 = mVar7 + 1;
              } while (frameCount != mVar7);
              return MA_SUCCESS;
            }
            return MA_SUCCESS;
          }
          if (frameCount != 0) {
            mVar7 = 0;
            do {
              *(undefined4 *)((long)pFramesOut + mVar7 * 8) =
                   *(undefined4 *)((long)pFramesIn + mVar7 * 8);
              *(float *)((long)pFramesOut + mVar7 * 8 + 4) =
                   *(float *)((long)pFramesIn + mVar7 * 8 + 4) * (fVar1 + 1.0);
              mVar7 = mVar7 + 1;
            } while (frameCount != mVar7);
            return MA_SUCCESS;
          }
          return MA_SUCCESS;
        }
        if (pFramesOut == pFramesIn) {
          if (frameCount != 0) {
            mVar7 = 0;
            do {
              *(float *)((long)pFramesOut + mVar7 * 8) =
                   *(float *)((long)pFramesIn + mVar7 * 8) * (1.0 - fVar1);
              mVar7 = mVar7 + 1;
            } while (frameCount != mVar7);
            return MA_SUCCESS;
          }
          return MA_SUCCESS;
        }
        if (frameCount != 0) {
          mVar7 = 0;
          do {
            *(float *)((long)pFramesOut + mVar7 * 8) =
                 *(float *)((long)pFramesIn + mVar7 * 8) * (1.0 - fVar1);
            *(undefined4 *)((long)pFramesOut + mVar7 * 8 + 4) =
                 *(undefined4 *)((long)pFramesIn + mVar7 * 8 + 4);
            mVar7 = mVar7 + 1;
          } while (frameCount != mVar7);
          return MA_SUCCESS;
        }
        return MA_SUCCESS;
      }
    }
    else if (((fVar1 != 0.0) || (NAN(fVar1))) && (mVar5 == ma_format_f32)) {
      if (fVar1 <= 0.0) {
        if (frameCount == 0) {
          return MA_SUCCESS;
        }
        mVar7 = 0;
        do {
          fVar2 = *(float *)((long)pFramesIn + mVar7 * 8 + 4);
          *(float *)((long)pFramesOut + mVar7 * 8) =
               fVar2 * (0.0 - fVar1) + *(float *)((long)pFramesIn + mVar7 * 8);
          *(float *)((long)pFramesOut + mVar7 * 8 + 4) = fVar2 * (fVar1 + 1.0);
          mVar7 = mVar7 + 1;
        } while (frameCount != mVar7);
        return MA_SUCCESS;
      }
      if (frameCount != 0) {
        mVar7 = 0;
        do {
          fVar2 = *(float *)((long)pFramesIn + mVar7 * 8);
          fVar3 = *(float *)((long)pFramesIn + mVar7 * 8 + 4);
          *(float *)((long)pFramesOut + mVar7 * 8) = (1.0 - fVar1) * fVar2;
          *(float *)((long)pFramesOut + mVar7 * 8 + 4) = fVar2 * fVar1 + fVar3;
          mVar7 = mVar7 + 1;
        } while (frameCount != mVar7);
        return MA_SUCCESS;
      }
      return MA_SUCCESS;
    }
    if (pFramesOut == pFramesIn) {
      return MA_SUCCESS;
    }
    uVar6 = (ulong)(uint)((&DAT_0019eb10)[mVar5] * 2);
  }
  else {
    if (pFramesOut == pFramesIn) {
      return MA_SUCCESS;
    }
    uVar6 = (ulong)(mVar4 * (&DAT_0019eb10)[pPanner->format]);
  }
  memcpy(pFramesOut,pFramesIn,uVar6 * frameCount);
  return MA_SUCCESS;
}

Assistant:

MA_API ma_result ma_panner_process_pcm_frames(ma_panner* pPanner, void* pFramesOut, const void* pFramesIn, ma_uint64 frameCount)
{
    if (pPanner == NULL || pFramesOut == NULL || pFramesIn == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pPanner->channels == 2) {
        /* Stereo case. For now assume channel 0 is left and channel right is 1, but should probably add support for a channel map. */
        if (pPanner->mode == ma_pan_mode_balance) {
            ma_stereo_balance_pcm_frames(pFramesOut, pFramesIn, frameCount, pPanner->format, pPanner->pan);
        } else {
            ma_stereo_pan_pcm_frames(pFramesOut, pFramesIn, frameCount, pPanner->format, pPanner->pan);
        }
    } else {
        if (pPanner->channels == 1) {
            /* Panning has no effect on mono streams. */
            ma_copy_pcm_frames(pFramesOut, pFramesIn, frameCount, pPanner->format, pPanner->channels);
        } else {
            /* For now we're not going to support non-stereo set ups. Not sure how I want to handle this case just yet. */
            ma_copy_pcm_frames(pFramesOut, pFramesIn, frameCount, pPanner->format, pPanner->channels);
        }
    }

    return MA_SUCCESS;
}